

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall
boost::runtime::basic_param::usage(basic_param *this,ostream *ostr,cstring *negation_prefix_)

{
  pointer s2;
  pointer ppVar1;
  long lVar2;
  bool bVar3;
  ostream *poVar4;
  size_t sVar5;
  _func_int **pp_Var6;
  char **ppcVar7;
  long *plVar8;
  string *psVar9;
  char *local_78;
  char *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  poVar4 = std::operator<<(ostr,"Parameter: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->p_name);
  std::operator<<(poVar4,'\n');
  if ((this->p_description)._M_string_length != 0) {
    poVar4 = std::operator<<(ostr,' ');
    poVar4 = std::operator<<(poVar4,(string *)&this->p_description);
    std::operator<<(poVar4,'\n');
  }
  std::operator<<(ostr," Command line formats:\n");
  ppVar1 = (this->m_cla_ids).
           super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (string *)
                &((this->m_cla_ids).
                  super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_value_separator;
      s2 = (pointer)(psVar9 + -0x40), s2 != ppVar1; psVar9 = psVar9 + 0x68) {
    bVar3 = unit_test::operator==((basic_cstring<const_char> *)help_prefix,(std_string *)s2);
    if (!bVar3) {
      poVar4 = std::operator<<(ostr,"   ");
      std::operator<<(poVar4,(string *)s2);
      lVar2 = *(long *)(psVar9 + -0x20);
      if (psVar9[0x20] == (string)0x1) {
        local_50 = lVar2 + *(long *)(psVar9 + -0x18);
        local_48 = *(undefined4 *)&negation_prefix_->m_begin;
        uStack_44 = *(undefined4 *)((long)&negation_prefix_->m_begin + 4);
        uStack_40 = *(undefined4 *)&negation_prefix_->m_end;
        uStack_3c = *(undefined4 *)((long)&negation_prefix_->m_end + 4);
        pp_Var6 = this->_vptr_basic_param;
        plVar8 = &local_58;
        ppcVar7 = (char **)&local_48;
        local_58 = lVar2;
      }
      else {
        local_60 = lVar2 + *(long *)(psVar9 + -0x18);
        local_78 = "";
        local_68 = lVar2;
        sVar5 = unit_test::ut_detail::bcs_char_traits_impl<const_char>::length("");
        local_70 = "\t" + sVar5 + 1;
        pp_Var6 = this->_vptr_basic_param;
        plVar8 = &local_68;
        ppcVar7 = &local_78;
      }
      (*pp_Var6[7])(this,ostr,plVar8,ppcVar7);
      bVar3 = (this->p_has_optional_value).super_class_property<bool>.value;
      if (bVar3 == true) {
        std::operator<<(ostr,'[');
      }
      if (*(long *)(psVar9 + 8) == 0) {
        std::operator<<(ostr,' ');
      }
      else {
        std::operator<<(ostr,psVar9);
      }
      (*this->_vptr_basic_param[8])(this,ostr);
      if (bVar3 != false) {
        std::operator<<(ostr,']');
      }
      std::operator<<(ostr,'\n');
    }
  }
  if ((this->p_env_var)._M_string_length != 0) {
    poVar4 = std::operator<<(ostr," Environment variable: ");
    poVar4 = std::operator<<(poVar4,(string *)&this->p_env_var);
    std::operator<<(poVar4,'\n');
  }
  return;
}

Assistant:

virtual void            usage( std::ostream& ostr, cstring negation_prefix_ )
    {
        ostr     << "Parameter: " << p_name << '\n';
        if( !p_description.empty() )
            ostr << ' ' << p_description << '\n';

        ostr     << " Command line formats:\n";
        BOOST_TEST_FOREACH( parameter_cla_id const&, id, cla_ids() ) {
            if( id.m_prefix == help_prefix )
                continue;

            ostr << "   " << id.m_prefix;
            if( id.m_negatable )
                cla_name_help( ostr, id.m_tag, negation_prefix_ );
            else
                cla_name_help( ostr, id.m_tag, "" );

            bool optional_value_ = false;

            if( p_has_optional_value ) {
                optional_value_ = true;
                ostr << '[';
            }

            if( id.m_value_separator.empty() )
                ostr << ' ';
            else {
                ostr << id.m_value_separator;
            }

            value_help( ostr );

            if( optional_value_ )
                ostr << ']';

            ostr << '\n';
        }
        if( !p_env_var.empty() )
            ostr << " Environment variable: " << p_env_var << '\n';
    }